

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
               (Context *context,Printer *printer,EnumDescriptor *descriptor,bool immutable,
               string *suffix)

{
  EnumDescriptor *this;
  EnumDescriptor *printer_00;
  bool bVar1;
  Options *pOVar2;
  string_view suffix_00;
  Options local_d8;
  byte local_72;
  allocator<char> local_71;
  undefined1 local_70 [16];
  string local_60;
  string_view local_40;
  string *local_30;
  string *suffix_local;
  EnumDescriptor *pEStack_20;
  bool immutable_local;
  EnumDescriptor *descriptor_local;
  Printer *printer_local;
  Context *context_local;
  
  local_30 = suffix;
  suffix_local._7_1_ = immutable;
  pEStack_20 = descriptor;
  descriptor_local = (EnumDescriptor *)printer;
  printer_local = (Printer *)context;
  bVar1 = IsOwnFile<google::protobuf::EnumDescriptor>(descriptor,immutable);
  printer_00 = descriptor_local;
  if (bVar1) {
    pOVar2 = Context::options((Context *)printer_local);
    this = pEStack_20;
    local_72 = 0;
    if ((pOVar2->annotate_code & 1U) == 0) {
      std::allocator<char>::allocator();
      local_72 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,anon_var_dwarf_37cdd0 + 5,&local_71);
    }
    else {
      local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
      suffix_00._M_str = (char *)suffix;
      suffix_00._M_len = local_70._8_8_;
      AnnotationFileName<google::protobuf::EnumDescriptor>
                (&local_60,(java *)this,local_70._0_8_,suffix_00);
    }
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    pOVar2 = Context::options((Context *)printer_local);
    Options::Options(&local_d8,pOVar2);
    PrintGeneratedAnnotation((Printer *)printer_00,'$',local_40,&local_d8);
    Options::~Options(&local_d8);
    std::__cxx11::string::~string((string *)&local_60);
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator(&local_71);
    }
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const std::string& suffix = "") {
  if (IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             context->options().annotate_code
                                 ? AnnotationFileName(descriptor, suffix)
                                 : "",
                             context->options());
  }
}